

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall
kj::ExceptionCallback::RootExceptionCallback::onRecoverableException
          (RootExceptionCallback *this,Exception *exception)

{
  char cVar1;
  ExceptionImpl *this_00;
  
  cVar1 = std::uncaught_exception();
  if (cVar1 != '\0') {
    logException(this,ERROR,exception);
    return;
  }
  this_00 = (ExceptionImpl *)__cxa_allocate_exception(0x178);
  ExceptionImpl::ExceptionImpl(this_00,exception);
  __cxa_throw(this_00,&ExceptionImpl::typeinfo,ExceptionImpl::~ExceptionImpl);
}

Assistant:

void onRecoverableException(Exception&& exception) override {
#if KJ_NO_EXCEPTIONS
    logException(LogSeverity::ERROR, mv(exception));
#else
    if (std::uncaught_exception()) {
      // Bad time to throw an exception.  Just log instead.
      //
      // TODO(someday): We should really compare uncaughtExceptionCount() against the count at
      //   the innermost runCatchingExceptions() frame in this thread to tell if exceptions are
      //   being caught correctly.
      logException(LogSeverity::ERROR, mv(exception));
    } else {
      throw ExceptionImpl(mv(exception));
    }
#endif
  }